

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::attachClause(Solver *this,CRef cr)

{
  bool bVar1;
  int iVar2;
  Lit p;
  vec<Minisat::Watcher> *idx;
  CRef in_ESI;
  long in_RDI;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *ws;
  Clause *c;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  CRef cr_00;
  Lit *in_stack_ffffffffffffff88;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
  *in_stack_ffffffffffffff90;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_00;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_58;
  Watcher local_44;
  int local_3c;
  int local_38;
  int local_34;
  Watcher local_30;
  int local_28;
  int local_24;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_20;
  Clause *local_18;
  CRef local_c;
  
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (Ref)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
  iVar2 = Clause::size(local_18);
  if (iVar2 == 2) {
    local_58 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
               (in_RDI + 0x2b0);
  }
  else {
    local_58 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
               (in_RDI + 0x2e8);
  }
  local_20 = local_58;
  local_28 = (int)Clause::operator[](local_18,0);
  local_24 = (int)operator~((Lit)local_28);
  idx = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  cr_00 = local_c;
  local_34 = (int)Clause::operator[](local_18,1);
  Watcher::Watcher(&local_30,cr_00,(Lit)local_34);
  vec<Minisat::Watcher>::push
            ((vec<Minisat::Watcher> *)CONCAT44(cr_00,in_stack_ffffffffffffff80),(Watcher *)local_58)
  ;
  this_00 = local_20;
  local_3c = (int)Clause::operator[](local_18,1);
  local_38 = (int)operator~((Lit)local_3c);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::operator[]
            (this_00,(Lit *)idx);
  p = Clause::operator[](local_18,0);
  Watcher::Watcher(&local_44,local_c,p);
  vec<Minisat::Watcher>::push
            ((vec<Minisat::Watcher> *)CONCAT44(cr_00,in_stack_ffffffffffffff80),(Watcher *)local_58)
  ;
  bVar1 = Clause::learnt(local_18);
  if (bVar1) {
    iVar2 = Clause::size(local_18);
    *(long *)(in_RDI + 0x110) = (long)iVar2 + *(long *)(in_RDI + 0x110);
  }
  else {
    iVar2 = Clause::size(local_18);
    *(long *)(in_RDI + 0x108) = (long)iVar2 + *(long *)(in_RDI + 0x108);
  }
  return;
}

Assistant:

void Solver::attachClause(CRef cr)
{
    const Clause &c = ca[cr];
    statistics.solveSteps++;
    assert(c.size() > 1);
    OccLists<Lit, vec<Watcher>, WatcherDeleted> &ws = c.size() == 2 ? watches_bin : watches;
    ws[~c[0]].push(Watcher(cr, c[1]));
    ws[~c[1]].push(Watcher(cr, c[0]));
    if (c.learnt())
        learnts_literals += c.size();
    else
        clauses_literals += c.size();
}